

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

uint32_t __thiscall
basisu::bitwise_coder::put_bits(bitwise_coder *this,uint32_t bits,uint32_t num_bits)

{
  uint uVar1;
  ulong uVar2;
  
  if (0x20 < num_bits) {
    __assert_fail("num_bits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                  ,0x933,"uint32_t basisu::bitwise_coder::put_bits(uint32_t, uint32_t)");
  }
  if (bits >> ((byte)num_bits & 0x3f) == 0) {
    if (num_bits != 0) {
      this->m_total_bits = this->m_total_bits + (ulong)num_bits;
      uVar2 = (ulong)this->m_bit_buffer | (ulong)bits << ((byte)this->m_bit_buffer_size & 0x3f);
      uVar1 = this->m_bit_buffer_size + num_bits;
      while( true ) {
        this->m_bit_buffer_size = uVar1;
        if (uVar1 < 8) break;
        append_byte(this,(uint8_t)uVar2);
        uVar2 = uVar2 >> 8;
        uVar1 = this->m_bit_buffer_size - 8;
      }
      this->m_bit_buffer = (uint)uVar2 & 0xff;
    }
    return num_bits;
  }
  __assert_fail("bits < (1ULL << num_bits)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0x934,"uint32_t basisu::bitwise_coder::put_bits(uint32_t, uint32_t)");
}

Assistant:

inline uint32_t put_bits(uint32_t bits, uint32_t num_bits)
		{
			assert(num_bits <= 32);
			assert(bits < (1ULL << num_bits));

			if (!num_bits)
				return 0;

			m_total_bits += num_bits;

			uint64_t v = (static_cast<uint64_t>(bits) << m_bit_buffer_size) | m_bit_buffer;
			m_bit_buffer_size += num_bits;

			while (m_bit_buffer_size >= 8)
			{
				append_byte(static_cast<uint8_t>(v));
				v >>= 8;
				m_bit_buffer_size -= 8;
			}

			m_bit_buffer = static_cast<uint8_t>(v);
			return num_bits;
		}